

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.cpp
# Opt level: O2

void __thiscall
aeron::archive::util::PropertiesReader::PropertiesReader
          (PropertiesReader *this,string *filename,bool skipErrors)

{
  char cVar1;
  istream *piVar2;
  runtime_error *this_00;
  string *this_01;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  ifstream ifs;
  
  (this->properties_)._M_h._M_buckets = &(this->properties_)._M_h._M_single_bucket;
  (this->properties_)._M_h._M_bucket_count = 1;
  (this->properties_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties_)._M_h._M_element_count = 0;
  (this->properties_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->properties_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->properties_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::ifstream::ifstream(&ifs,(string *)filename,_S_in);
  cVar1 = ::std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      this_01 = &line;
      piVar2 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifs,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      parseLine(&local_278,(PropertiesReader *)this_01,&line);
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this,&local_278);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_278);
    }
    ::std::__cxx11::string::~string((string *)&line);
    ::std::ifstream::~ifstream(&ifs);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278,
                   "can\'t open property file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
  ::std::runtime_error::runtime_error(this_00,(string *)&local_278);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PropertiesReader::PropertiesReader(const std::string& filename, bool skipErrors) {
    std::ifstream ifs(filename);

    if (!ifs.is_open()) {
        throw std::runtime_error("can't open property file: " + filename);
    }

    for (std::string line; std::getline(ifs, line);) {
        try {
            properties_.emplace(parseLine(line));
        } catch (const std::exception& e) {
            // rethrow if requested
            if (!skipErrors) {
                throw e;
            }
        }
    }
}